

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_lambda(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,render_handler *handler,
             basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *var,context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *ctx,render_lambda_escape escape,string_type *text,bool parse_with_same_context)

{
  bool bVar1;
  byte bVar2;
  basic_lambda2<std::__cxx11::basic_string<char>_> *this_00;
  basic_lambda<std::__cxx11::basic_string<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_b0 [8];
  basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  renderer;
  undefined1 local_98 [8];
  type1 render;
  undefined1 local_60 [8];
  type2 render2;
  bool parse_with_same_context_local;
  string_type *text_local;
  render_lambda_escape escape_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *var_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  render2._M_invoker._7_1_ = parse_with_same_context;
  render._M_invoker = (_Invoker_type)this;
  std::function<std::__cxx11::string(std::__cxx11::string_const&,bool)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render_lambda(std::function<void(std::__cxx11::string_const&)>const&,kainjow::mustache::basic_data<std::__cxx11::string>const*,kainjow::mustache::context_internal<std::__cxx11::string>&,kainjow::mustache::basic_mustache<std::__cxx11::string>::render_lambda_escape,std::__cxx11::string_const&,bool)::_lambda(std::__cxx11::string_const&,bool)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&,bool)> *)local_60,
             (anon_class_24_4_a93b1dce *)&render._M_invoker);
  renderer.type2_ = (type2 *)local_60;
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render_lambda(std::function<void(std::__cxx11::string_const&)>const&,kainjow::mustache::basic_data<std::__cxx11::string>const*,kainjow::mustache::context_internal<std::__cxx11::string>&,kainjow::mustache::basic_mustache<std::__cxx11::string>::render_lambda_escape,std::__cxx11::string_const&,bool)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)local_98,
             (anon_class_8_1_c477243c *)&renderer.type2_);
  bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::is_lambda2(var);
  if (bVar1) {
    basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::basic_renderer((basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0,(type1 *)local_98,(type2 *)local_60);
    this_00 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::lambda2_value(var);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
    ::operator()(&local_e0,this_00,text,
                 (basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b0);
    render_result(this,ctx,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    render_current_line(this,handler,ctx,
                        (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0);
    this_01 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::lambda_value(var);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&local_120,this_01,text);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&local_100,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_98,&local_120);
    render_result(this,ctx,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  bVar2 = std::__cxx11::string::empty();
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_98);
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)local_60);
  return (bool)(bVar2 & 1);
}

Assistant:

bool render_lambda(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, render_lambda_escape escape, const string_type& text, bool parse_with_same_context) {
        const typename basic_renderer<string_type>::type2 render2 = [this, &ctx, parse_with_same_context, escape](const string_type& text, bool escaped) {
            const auto process_template = [this, &ctx, escape, escaped](basic_mustache& tmpl) -> string_type {
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                context_internal<string_type> render_ctx{ctx.ctx}; // start a new line_buffer
                const auto str = tmpl.render(render_ctx);
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                bool do_escape = false;
                switch (escape) {
                    case render_lambda_escape::escape:
                        do_escape = true;
                        break;
                    case render_lambda_escape::unescape:
                        do_escape = false;
                        break;
                    case render_lambda_escape::optional:
                        do_escape = escaped;
                        break;
                }
                return do_escape ? escape_(str) : str;
            };
            if (parse_with_same_context) {
                basic_mustache tmpl{text, ctx};
                tmpl.set_custom_escape(escape_);
                return process_template(tmpl);
            }
            basic_mustache tmpl{text};
            tmpl.set_custom_escape(escape_);
            return process_template(tmpl);
        };
        const typename basic_renderer<string_type>::type1 render = [&render2](const string_type& text) {
            return render2(text, false);
        };
        if (var->is_lambda2()) {
            const basic_renderer<string_type> renderer{render, render2};
            render_result(ctx, var->lambda2_value()(text, renderer));
        } else {
            render_current_line(handler, ctx, nullptr);
            render_result(ctx, render(var->lambda_value()(text)));
        }
        return error_message_.empty();
    }